

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_color nk_hsva_f(float h,float s,float v,float a)

{
  nk_color nVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float b;
  float fVar5;
  float fVar6;
  
  if (s <= 0.0) {
    nVar1 = nk_rgb_f(v,v,v);
    return nVar1;
  }
  fVar2 = h / 0.16666667;
  b = (1.0 - s) * v;
  fVar6 = (1.0 - s * (fVar2 - (float)(int)fVar2)) * v;
  fVar3 = b;
  fVar4 = v;
  if ((uint)(int)fVar2 < 5) {
    fVar5 = (1.0 - s * (1.0 - (fVar2 - (float)(int)fVar2))) * v;
    switch((int)fVar2) {
    case 0:
      fVar3 = fVar5;
      break;
    case 1:
      fVar3 = v;
      fVar4 = fVar6;
      break;
    case 2:
      fVar3 = v;
      fVar4 = b;
      b = fVar5;
      break;
    case 3:
      goto switchD_001098ec_caseD_3;
    case 4:
      fVar4 = fVar5;
      b = v;
    }
  }
  else {
switchD_001098ec_caseD_3:
    b = fVar6;
  }
  nVar1 = nk_rgba_f(fVar4,fVar3,b,a);
  return nVar1;
}

Assistant:

NK_API struct nk_color
nk_hsva_f(float h, float s, float v, float a)
{
    struct nk_colorf out = {0,0,0,0};
    float p, q, t, f;
    int i;

    if (s <= 0.0f) {
        out.r = v; out.g = v; out.b = v;
        return nk_rgb_f(out.r, out.g, out.b);
    }

    h = h / (60.0f/360.0f);
    i = (int)h;
    f = h - (float)i;
    p = v * (1.0f - s);
    q = v * (1.0f - (s * f));
    t = v * (1.0f - s * (1.0f - f));

    switch (i) {
    case 0: out.r = v; out.g = t; out.b = p; break;
    case 1: out.r = q; out.g = v; out.b = p; break;
    case 2: out.r = p; out.g = v; out.b = t; break;
    case 4: out.r = t; out.g = p; out.b = v; break;
    case 5: default: out.r = v; out.g = p; out.b = q; break;
    }
    return nk_rgba_f(out.r, out.g, out.b, a);
}